

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

Gia_Man_t * Jf_ManDeriveMappingGia(Jf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Jf_Par_t *pJVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  word *pwVar7;
  Vec_Mem_t *pVVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  undefined4 *__s;
  Vec_Int_t *p_00;
  int *piVar13;
  Vec_Int_t *p_01;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar14;
  char *pcVar15;
  Gia_Man_t *pGVar16;
  Gia_Obj_t *pGVar17;
  Vec_Int_t *pVVar18;
  Cnf_Dat_t *pCVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int Fill;
  long lVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  word uTruth;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  word local_40;
  word *local_38;
  
  pGVar16 = p->pGia;
  iVar11 = pGVar16->nObjs;
  piVar12 = (int *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar20 = iVar11;
  }
  piVar12[1] = 0;
  *piVar12 = iVar20;
  if (iVar20 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)iVar20 << 2);
  }
  *(undefined4 **)(piVar12 + 2) = __s;
  piVar12[1] = iVar11;
  if (__s != (undefined4 *)0x0) {
    memset(__s,0xff,(long)iVar11 << 2);
  }
  pJVar3 = p->pPars;
  iVar2 = (int)pJVar3->Edge;
  iVar25 = pGVar16->nObjs + (int)pJVar3->Area;
  iVar20 = iVar2 + iVar25 * 2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < (iVar2 + iVar25 * 2) - 1U) {
    iVar21 = iVar20;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar21;
  if (iVar21 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar21 << 2);
  }
  p_00->pArray = piVar13;
  p_00->nSize = iVar20;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar20 << 2);
  }
  iVar20 = (int)pJVar3->Area;
  iVar2 = (int)pJVar3->Edge;
  iVar25 = iVar2 + iVar20 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < iVar2 + iVar20 * 2 + 999U) {
    iVar21 = iVar25;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar21;
  if (iVar21 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar21 << 2);
  }
  p_01->pArray = piVar13;
  p_01->nSize = iVar25;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar25 << 2);
  }
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar13 = (int *)malloc(0x40000);
  vMemory->pArray = piVar13;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar13 = (int *)malloc(0x40);
  p_02->pArray = piVar13;
  local_40 = 0;
  if (pJVar3->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5a3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  if (pJVar3->fGenCnf == 0) {
    local_60 = (Vec_Int_t *)0x0;
    local_58 = (Vec_Int_t *)0x0;
  }
  else {
    local_60 = (Vec_Int_t *)malloc(0x10);
    local_60->nCap = 1000;
    local_60->nSize = 0;
    piVar13 = (int *)malloc(4000);
    local_60->pArray = piVar13;
    local_58 = (Vec_Int_t *)malloc(0x10);
    local_58->nCap = 1000;
    local_58->nSize = 0;
    piVar13 = (int *)malloc(4000);
    local_58->pArray = piVar13;
    Vec_IntPush(local_58,0);
    Vec_IntPush(local_60,1);
  }
  p_03 = Gia_ManStart(p->pGia->nObjs);
  pGVar16 = p->pGia;
  pcVar4 = pGVar16->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar4);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar4);
  }
  p_03->pName = pcVar15;
  pcVar4 = pGVar16->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar4);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar4);
  }
  p_03->pSpec = pcVar15;
  if (iVar11 < 1) {
LAB_0075c7b2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pGVar16 = p->pGia;
  pVVar18 = pGVar16->vCis;
  if (0 < pVVar18->nSize) {
    lVar24 = 0;
    do {
      iVar20 = pVVar18->pArray[lVar24];
      if (((long)iVar20 < 0) || (pGVar16->nObjs <= iVar20)) goto LAB_0075c755;
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar17 = Gia_ManAppendObj(p_03);
      uVar22 = *(ulong *)pGVar17;
      *(ulong *)pGVar17 = uVar22 | 0x9fffffff;
      *(ulong *)pGVar17 =
           uVar22 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_03->pObjs;
      if ((pGVar17 < pGVar5) || (pGVar5 + p_03->nObjs <= pGVar17)) goto LAB_0075c736;
      Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar17 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_03->pObjs;
      if ((pGVar17 < pGVar5) || (pGVar5 + p_03->nObjs <= pGVar17)) goto LAB_0075c736;
      if (iVar11 <= iVar20) goto LAB_0075c7b2;
      __s[iVar20] = (int)((ulong)((long)pGVar17 - (long)pGVar5) >> 2) * 0x55555556;
      lVar24 = lVar24 + 1;
      pGVar16 = p->pGia;
      pVVar18 = pGVar16->vCis;
    } while (lVar24 < pVVar18->nSize);
  }
  pGVar16 = p->pGia;
  uVar22 = (ulong)(uint)pGVar16->nObjs;
  if (0 < pGVar16->nObjs) {
    local_38 = &local_40;
    lVar24 = 0;
    do {
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      uVar6 = *(undefined8 *)(pGVar16->pObjs + lVar24);
      uVar10 = (uint)uVar6;
      if (((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) &&
         ((((int)uVar10 < 0 || ((uVar10 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar10 & 0x1fffffff) != ((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff))))) {
        if ((int)uVar22 <= lVar24) goto LAB_0075c736;
        if (pGVar16->pRefs[lVar24] != 0) {
          if ((p->vCuts).nSize <= lVar24) goto LAB_0075c793;
          uVar10 = (p->vCuts).pArray[lVar24];
          pwVar7 = (p->pMem).pPages[(int)uVar10 >> ((byte)(p->pMem).nPageSize & 0x1f)];
          lVar23 = (long)(int)(uVar10 & (p->pMem).uPageMask);
          uVar10 = *(uint *)((long)pwVar7 + lVar23 * 8 + 4);
          uVar26 = uVar10 >> 9;
          if ((uVar10 & 0xf) == 1) {
            if (uVar26 != 1) {
              __assert_fail("Class == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                            ,0x5c3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
            }
            uVar26 = (uint)pwVar7[lVar23 + 1];
            if ((int)uVar26 < 0) goto LAB_0075c774;
            uVar1 = *(uint *)(*(long *)(piVar12 + 2) + (ulong)(uVar26 >> 1) * 4);
            if ((int)uVar1 < 0) goto LAB_0075c774;
            if (piVar12[1] <= lVar24) goto LAB_0075c7b2;
            *(uint *)(*(long *)(piVar12 + 2) + lVar24 * 4) = uVar1 ^ (uVar26 ^ uVar10 >> 8) & 1;
          }
          else if ((uVar10 & 0xf) == 0) {
            if (0x1ff < uVar10) {
              __assert_fail("Class == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                            ,0x5bd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
            }
            if (piVar12[1] <= lVar24) goto LAB_0075c7b2;
            *(uint *)(*(long *)(piVar12 + 2) + lVar24 * 4) = uVar10 >> 8;
          }
          else {
            if (p->pPars->fFuncDsd == 0) {
              pVVar8 = p->vTtMem;
              if (pVVar8->nEntries <= (int)uVar26) {
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              local_38 = pVVar8->ppPages[uVar26 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                         (ulong)(pVVar8->PageMask & uVar26) * (long)pVVar8->nEntrySize;
            }
            else {
              local_40 = Sdm_ManReadDsdTruth(p->pDsd,uVar26);
            }
            if (p->pDsd != (Sdm_Man_t *)0x0) {
              uVar10 = Sdm_ManReadDsdVarNum(p->pDsd,uVar26);
              if (uVar10 != (*(uint *)((long)pwVar7 + lVar23 * 8 + 4) & 0xf)) {
                __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                              ,0x5cd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
              }
            }
            p_02->nSize = 0;
            if ((*(byte *)((long)pwVar7 + lVar23 * 8 + 4) & 0xf) != 0) {
              uVar22 = 0;
              do {
                uVar10 = *(uint *)((long)pwVar7 + uVar22 * 4 + lVar23 * 8 + 8);
                if (uVar10 == 0) break;
                if ((int)uVar10 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x135,"int Abc_Lit2LitL(int *, int)");
                }
                uVar26 = *(uint *)(*(long *)(piVar12 + 2) + (ulong)(uVar10 >> 1) * 4);
                if ((int)uVar26 < 0) goto LAB_0075c774;
                Vec_IntPush(p_02,uVar26 ^ uVar10 & 1);
                uVar22 = uVar22 + 1;
              } while (uVar22 < (*(uint *)((long)pwVar7 + lVar23 * 8 + 4) & 0xf));
            }
            uVar10 = Kit_TruthToGia(p_03,(uint *)local_38,p_02->nSize,vMemory,p_02,0);
            if (p->pPars->fGenCnf != 0) {
              Jf_ManGenCnf(local_40,uVar10,p_02,local_60,local_58,vMemory);
            }
            if ((int)uVar10 < 0) goto LAB_0075c774;
            if (piVar12[1] <= lVar24) goto LAB_0075c7b2;
            lVar9 = *(long *)(piVar12 + 2);
            *(uint *)(lVar9 + lVar24 * 4) =
                 *(uint *)((long)pwVar7 + lVar23 * 8 + 4) >> 8 & 1 ^ uVar10;
            uVar10 = uVar10 >> 1;
            iVar11 = p_01->nSize;
            Vec_IntFillExtra(p_00,uVar10 + 1,(int)lVar9);
            if (p_00->nSize <= (int)uVar10) goto LAB_0075c7b2;
            p_00->pArray[uVar10] = iVar11;
            Vec_IntPush(p_01,p_02->nSize);
            if (0 < p_02->nSize) {
              lVar23 = 0;
              do {
                if (p_02->pArray[lVar23] < 0) goto LAB_0075c7d1;
                Vec_IntPush(p_01,(uint)p_02->pArray[lVar23] >> 1);
                lVar23 = lVar23 + 1;
              } while (lVar23 < p_02->nSize);
            }
            uVar10 = *(uint *)(lVar9 + lVar24 * 4);
            if ((int)uVar10 < 0) {
LAB_0075c7d1:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            Vec_IntPush(p_01,uVar10 >> 1);
          }
        }
      }
      lVar24 = lVar24 + 1;
      pGVar16 = p->pGia;
      uVar22 = (ulong)pGVar16->nObjs;
    } while (lVar24 < (long)uVar22);
  }
  pGVar16 = p->pGia;
  pVVar18 = pGVar16->vCos;
  if (0 < pVVar18->nSize) {
    lVar24 = 0;
    do {
      iVar11 = pVVar18->pArray[lVar24];
      if (((long)iVar11 < 0) || (iVar20 = pGVar16->nObjs, iVar20 <= iVar11)) {
LAB_0075c755:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = pGVar16->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      iVar2 = p->pPars->fGenCnf;
      if (iVar2 != 0) {
        p_02->nSize = 0;
      }
      if (iVar20 <= iVar11) {
LAB_0075c736:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar5 = pGVar5 + iVar11;
      uVar10 = *(uint *)pGVar5;
      uVar26 = iVar11 - (uVar10 & 0x1fffffff);
      if (((int)uVar26 < 0) || (piVar12[1] <= (int)uVar26)) {
LAB_0075c793:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar26 = *(uint *)(*(long *)(piVar12 + 2) + (ulong)uVar26 * 4);
      if (iVar2 != 0) {
        if ((int)uVar26 < 0) {
LAB_0075c774:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Vec_IntPush(p_02,uVar10 >> 0x1d & 1 ^ uVar26);
      }
      if ((int)uVar26 < 0) goto LAB_0075c774;
      iVar11 = Gia_ManAppendCo(p_03,*(uint *)pGVar5 >> 0x1d & 1 ^ uVar26);
      if (p->pPars->fGenCnf != 0) {
        Jf_ManGenCnf(0xaaaaaaaaaaaaaaaa,iVar11,p_02,local_60,local_58,vMemory);
      }
      lVar24 = lVar24 + 1;
      pGVar16 = p->pGia;
      pVVar18 = pGVar16->vCos;
    } while (lVar24 < pVVar18->nSize);
  }
  if (*(void **)(piVar12 + 2) != (void *)0x0) {
    free(*(void **)(piVar12 + 2));
    piVar12[2] = 0;
    piVar12[3] = 0;
  }
  free(piVar12);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  iVar11 = p_03->nObjs;
  if (iVar11 < p_00->nSize) {
    p_00->nSize = iVar11;
  }
  else {
    Vec_IntFillExtra(p_00,iVar11,Fill);
  }
  if (p_00->nSize != p_03->nObjs) {
    __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5f2,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  if (0 < p_00->nSize) {
    piVar12 = p_00->pArray;
    lVar24 = 0;
    do {
      iVar11 = piVar12[lVar24];
      if (0 < iVar11) {
        piVar12[lVar24] = iVar11 + p_03->nObjs;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < p_00->nSize);
  }
  iVar11 = p_01->nSize;
  if (0 < (long)iVar11) {
    piVar12 = p_01->pArray;
    lVar24 = 0;
    do {
      Vec_IntPush(p_00,piVar12[lVar24]);
      lVar24 = lVar24 + 1;
    } while (iVar11 != lVar24);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p_03->vMapping == (Vec_Int_t *)0x0) {
    p_03->vMapping = p_00;
    Gia_ManSetRegNum(p_03,p->pGia->nRegs);
    pJVar3 = p->pPars;
    if (pJVar3->fGenCnf != 0) {
      if (pJVar3->fCnfObjIds == 0) {
        pCVar19 = Jf_ManCreateCnfRemap(p_03,local_60,local_58,pJVar3->fAddOrCla);
      }
      else {
        pCVar19 = Jf_ManCreateCnf(p_03,local_60,local_58);
      }
      p_03->pData = pCVar19;
    }
    if (local_60 != (Vec_Int_t *)0x0) {
      if (local_60->pArray != (int *)0x0) {
        free(local_60->pArray);
        local_60->pArray = (int *)0x0;
      }
      free(local_60);
    }
    if (local_58 != (Vec_Int_t *)0x0) {
      if (local_58->pArray != (int *)0x0) {
        free(local_58->pArray);
        local_58->pArray = (int *)0x0;
      }
      free(local_58);
    }
    return p_03;
  }
  __assert_fail("pNew->vMapping == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                ,0x5f9,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
}

Assistant:

Gia_Man_t * Jf_ManDeriveMappingGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Vec_Int_t * vLits = NULL, * vClas = NULL;
    int i, k, iLit, Class, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    if ( p->pPars->fGenCnf )
    {
        vLits = Vec_IntAlloc( 1000 );
        vClas = Vec_IntAlloc( 1000 );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, 1 );
    }
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        Class = Jf_CutFuncClass( pCut );
        if ( Jf_CutSize(pCut) == 0 )
        {
            assert( Class == 0 );
            Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
            continue;
        }
        if ( Jf_CutSize(pCut) == 1 )
        {
            assert( Class == 1 );
            iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
            iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( p->pPars->fFuncDsd )
            uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
        else
            pTruth = Vec_MemReadEntry(p->vTtMem, Class);
        assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        // collect leaves
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( uTruth, iLit, vLeaves, vLits, vClas, vCover );
        iLit = Abc_LitNotCond( iLit, Jf_CutFuncCompl(pCut) );
        Vec_IntWriteEntry( vCopies, i, iLit );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        if ( p->pPars->fGenCnf )
            Vec_IntClear( vLeaves );
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        if ( p->pPars->fGenCnf )
            Vec_IntPush( vLeaves, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( ABC_CONST(0xAAAAAAAAAAAAAAAA), iLit, vLeaves, vLits, vClas, vCover );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    // derive CNF
    if ( p->pPars->fGenCnf )
    {
        if ( p->pPars->fCnfObjIds )
            pNew->pData = Jf_ManCreateCnf( pNew, vLits, vClas );
        else
            pNew->pData = Jf_ManCreateCnfRemap( pNew, vLits, vClas, p->pPars->fAddOrCla );
    }
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vClas );
    return pNew;
}